

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_flat.h
# Opt level: O0

CordRepFlat * __thiscall
absl::cord_internal::CordRepFlat::Create(CordRepFlat *this,string_view data,size_t extra)

{
  size_type sVar1;
  unsigned_long *puVar2;
  CordRepFlat *this_00;
  char *__dest;
  const_pointer __src;
  CordRepFlat *flat;
  size_t extra_local;
  string_view data_local;
  
  flat = (CordRepFlat *)data._M_str;
  data_local._M_len = data._M_len;
  extra_local = (size_t)this;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&extra_local);
  if (sVar1 < 0xff4) {
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&extra_local);
    puVar2 = std::min<unsigned_long>((unsigned_long *)&flat,&kMaxFlatLength);
    this_00 = New(sVar1 + *puVar2);
    __dest = Data(this_00);
    __src = std::basic_string_view<char,_std::char_traits<char>_>::data
                      ((basic_string_view<char,_std::char_traits<char>_> *)&extra_local);
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&extra_local);
    memcpy(__dest,__src,sVar1);
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&extra_local);
    (this_00->super_CordRep).length = sVar1;
    return this_00;
  }
  __assert_fail("data.size() <= kMaxFlatLength",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_flat.h"
                ,0xa2,
                "static CordRepFlat *absl::cord_internal::CordRepFlat::Create(absl::string_view, size_t)"
               );
}

Assistant:

static CordRepFlat* Create(absl::string_view data, size_t extra = 0) {
    assert(data.size() <= kMaxFlatLength);
    CordRepFlat* flat = New(data.size() + (std::min)(extra, kMaxFlatLength));
    memcpy(flat->Data(), data.data(), data.size());
    flat->length = data.size();
    return flat;
  }